

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

char * fmt::v8::detail::
       parse_align<char,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v8::detail::specs_handler<char>_> *handler)

{
  specs_checker<fmt::v8::detail::specs_handler<char>_> *this;
  char *pcVar1;
  char cVar2;
  int iVar3;
  type count;
  basic_string_view<char> local_50;
  char local_39;
  specs_checker<fmt::v8::detail::specs_handler<char>_> *psStack_38;
  char c;
  char *p;
  type align;
  specs_checker<fmt::v8::detail::specs_handler<char>_> *handler_local;
  char *end_local;
  char *begin_local;
  
  p._7_1_ = begin != end;
  _align = handler;
  handler_local = (specs_checker<fmt::v8::detail::specs_handler<char>_> *)end;
  end_local = begin;
  ignore_unused<bool,char[1]>((bool *)((long)&p + 7),(char (*) [1])0x305f8b);
  pcVar1 = end_local;
  p._0_4_ = none;
  iVar3 = code_point_length<char>(end_local);
  psStack_38 = (specs_checker<fmt::v8::detail::specs_handler<char>_> *)(pcVar1 + iVar3);
  if (handler_local <= psStack_38) {
    psStack_38 = (specs_checker<fmt::v8::detail::specs_handler<char>_> *)end_local;
  }
  while( true ) {
    cVar2 = to_ascii<char,_0>(*(char *)&(psStack_38->super_specs_handler<char>).
                                        super_specs_setter<char>.specs_);
    pcVar1 = end_local;
    this = _align;
    if (cVar2 == '<') {
      p._0_4_ = left;
    }
    else if (cVar2 == '>') {
      p._0_4_ = right;
    }
    else if (cVar2 == '^') {
      p._0_4_ = center;
    }
    if ((align_t)p != none) break;
    if (psStack_38 == (specs_checker<fmt::v8::detail::specs_handler<char>_> *)end_local) {
      return end_local;
    }
    psStack_38 = (specs_checker<fmt::v8::detail::specs_handler<char>_> *)end_local;
  }
  if (psStack_38 != (specs_checker<fmt::v8::detail::specs_handler<char>_> *)end_local) {
    local_39 = *end_local;
    if (local_39 == '{') {
      specs_handler<char>::on_error
                (&_align->super_specs_handler<char>,"invalid fill character \'{\'");
      return end_local;
    }
    count = to_unsigned<long>((long)psStack_38 - (long)end_local);
    basic_string_view<char>::basic_string_view(&local_50,pcVar1,count);
    specs_setter<char>::on_fill((specs_setter<char> *)this,local_50);
    end_local = (char *)psStack_38;
  }
  end_local = (char *)((long)&(((specs_checker<fmt::v8::detail::specs_handler<char>_> *)end_local)->
                              super_specs_handler<char>).super_specs_setter<char>.specs_ + 1);
  specs_checker<fmt::v8::detail::specs_handler<char>_>::on_align(_align,(align_t)p);
  return end_local;
}

Assistant:

FMT_CONSTEXPR auto parse_align(const Char* begin, const Char* end,
                               Handler&& handler) -> const Char* {
  FMT_ASSERT(begin != end, "");
  auto align = align::none;
  auto p = begin + code_point_length(begin);
  if (p >= end) p = begin;
  for (;;) {
    switch (to_ascii(*p)) {
    case '<':
      align = align::left;
      break;
    case '>':
      align = align::right;
      break;
    case '^':
      align = align::center;
      break;
    default:
      break;
    }
    if (align != align::none) {
      if (p != begin) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        handler.on_fill(basic_string_view<Char>(begin, to_unsigned(p - begin)));
        begin = p + 1;
      } else
        ++begin;
      handler.on_align(align);
      break;
    } else if (p == begin) {
      break;
    }
    p = begin;
  }
  return begin;
}